

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse.c
# Opt level: O1

int64_t aom_highbd_sse_c(uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,int width,int height)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = 0;
  if (0 < height) {
    lVar2 = (long)b8 * 2;
    lVar4 = (long)a8 * 2;
    lVar1 = 0;
    do {
      if (0 < width) {
        uVar3 = 0;
        do {
          iVar6 = (uint)*(ushort *)(lVar4 + uVar3 * 2) - (uint)*(ushort *)(lVar2 + uVar3 * 2);
          lVar1 = lVar1 + (ulong)(uint)(iVar6 * iVar6);
          uVar3 = uVar3 + 1;
        } while ((uint)width != uVar3);
      }
      iVar5 = iVar5 + 1;
      lVar2 = lVar2 + (long)b_stride * 2;
      lVar4 = lVar4 + (long)a_stride * 2;
    } while (iVar5 != height);
    return lVar1;
  }
  return 0;
}

Assistant:

int64_t aom_highbd_sse_c(const uint8_t *a8, int a_stride, const uint8_t *b8,
                         int b_stride, int width, int height) {
  int y, x;
  int64_t sse = 0;
  uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++) {
      const int32_t diff = (int32_t)(a[x]) - (int32_t)(b[x]);
      sse += diff * diff;
    }

    a += a_stride;
    b += b_stride;
  }
  return sse;
}